

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O3

shared_ptr<ylt::metric::basic_static_gauge<double>_> __thiscall
ylt::metric::static_metric_manager<ylt::metric::ylt_system_tag_t>::
get_metric_static<ylt::metric::basic_static_gauge<double>>
          (static_metric_manager<ylt::metric::ylt_system_tag_t> *this,string *name)

{
  size_type sVar1;
  iterator iVar2;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined1 auVar4 [16];
  shared_ptr<ylt::metric::basic_static_gauge<double>_> sVar5;
  
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::static_metric>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::static_metric>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::static_metric>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::static_metric>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)name,in_RDX);
  _Var3._M_pi = extraout_RDX;
  if ((iVar2.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::static_metric>_>,_true>
       ._M_cur != (__node_type *)0x0) &&
     (*(long *)((long)iVar2.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::static_metric>_>,_true>
                      ._M_cur + 0x28) != 0)) {
    auVar4 = __dynamic_cast(*(long *)((long)iVar2.
                                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::static_metric>_>,_true>
                                            ._M_cur + 0x28),&static_metric::typeinfo,
                            &basic_static_gauge<double>::typeinfo,0);
    _Var3._M_pi = auVar4._8_8_;
    if (auVar4._0_8_ != (__buckets_ptr)0x0) {
      (this->metric_map_)._M_h._M_buckets = auVar4._0_8_;
      sVar1 = *(size_type *)
               ((long)iVar2.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::static_metric>_>,_true>
                      ._M_cur + 0x30);
      (this->metric_map_)._M_h._M_bucket_count = sVar1;
      if (sVar1 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(sVar1 + 8) = *(int *)(sVar1 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(sVar1 + 8) = *(int *)(sVar1 + 8) + 1;
        }
      }
      goto LAB_001a027a;
    }
  }
  (this->metric_map_)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->metric_map_)._M_h._M_bucket_count = 0;
LAB_001a027a:
  sVar5.super___shared_ptr<ylt::metric::basic_static_gauge<double>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  sVar5.super___shared_ptr<ylt::metric::basic_static_gauge<double>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<ylt::metric::basic_static_gauge<double>_>)
         sVar5.
         super___shared_ptr<ylt::metric::basic_static_gauge<double>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> get_metric_static(const std::string& name) {
    static_assert(std::is_base_of_v<static_metric, T>,
                  "must be dynamic metric");
    auto it = metric_map_.find(name);
    if (it == metric_map_.end()) {
      return nullptr;
    }
    return std::dynamic_pointer_cast<T>(it->second);
  }